

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestIterationEnd
          (PrettyUnitTestResultPrinter *this,UnitTest *unit_test,int param_2)

{
  _Alloc_hider _Var1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  int test_count;
  int test_suite_count;
  int test_count_00;
  int test_count_01;
  undefined4 in_register_00000014;
  string local_60;
  string local_40;
  
  ColoredPrintf(kGreen,"[==========] ",CONCAT44(in_register_00000014,param_2));
  uVar3 = UnitTest::test_to_run_count(unit_test);
  FormatTestCount_abi_cxx11_(&local_40,(testing *)(ulong)uVar3,test_count);
  _Var1._M_p = local_40._M_dataplus._M_p;
  uVar3 = UnitTest::test_suite_to_run_count(unit_test);
  FormatTestSuiteCount_abi_cxx11_(&local_60,(testing *)(ulong)uVar3,test_suite_count);
  printf("%s from %s ran.",_Var1._M_p,local_60._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  if (FLAGS_gtest_print_time == '\x01') {
    local_60._M_dataplus._M_p = (pointer)unit_test->impl_->elapsed_time_;
    StreamableToString<long>(&local_40,(long *)&local_60);
    printf(" (%s ms total)",local_40._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_40);
  }
  putchar(10);
  ColoredPrintf(kGreen,"[  PASSED  ] ");
  uVar3 = UnitTest::successful_test_count(unit_test);
  FormatTestCount_abi_cxx11_(&local_40,(testing *)(ulong)uVar3,test_count_00);
  printf("%s.\n",local_40._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_40);
  uVar3 = UnitTest::skipped_test_count(unit_test);
  if (0 < (int)uVar3) {
    ColoredPrintf(kGreen,"[  SKIPPED ] ");
    FormatTestCount_abi_cxx11_(&local_40,(testing *)(ulong)uVar3,test_count_01);
    printf("%s, listed below:\n",local_40._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_40);
    PrintSkippedTests(unit_test);
  }
  bVar2 = UnitTest::Passed(unit_test);
  if (!bVar2) {
    PrintFailedTests(unit_test);
    PrintFailedTestSuites(unit_test);
  }
  uVar3 = UnitTest::reportable_disabled_test_count(unit_test);
  if ((uVar3 != 0) && (FLAGS_gtest_also_run_disabled_tests == '\0')) {
    bVar2 = UnitTest::Passed(unit_test);
    if (bVar2) {
      putchar(10);
    }
    pcVar4 = "TESTS";
    if (uVar3 == 1) {
      pcVar4 = "TEST";
    }
    ColoredPrintf(kYellow,"  YOU HAVE %d DISABLED %s\n\n",(ulong)uVar3,pcVar4);
  }
  fflush(_stdout);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                     int /*iteration*/) {
  ColoredPrintf(GTestColor::kGreen, "[==========] ");
  printf("%s from %s ran.",
         FormatTestCount(unit_test.test_to_run_count()).c_str(),
         FormatTestSuiteCount(unit_test.test_suite_to_run_count()).c_str());
  if (GTEST_FLAG_GET(print_time)) {
    printf(" (%s ms total)",
           internal::StreamableToString(unit_test.elapsed_time()).c_str());
  }
  printf("\n");
  ColoredPrintf(GTestColor::kGreen, "[  PASSED  ] ");
  printf("%s.\n", FormatTestCount(unit_test.successful_test_count()).c_str());

  const int skipped_test_count = unit_test.skipped_test_count();
  if (skipped_test_count > 0) {
    ColoredPrintf(GTestColor::kGreen, "[  SKIPPED ] ");
    printf("%s, listed below:\n", FormatTestCount(skipped_test_count).c_str());
    PrintSkippedTests(unit_test);
  }

  if (!unit_test.Passed()) {
    PrintFailedTests(unit_test);
    PrintFailedTestSuites(unit_test);
  }

  int num_disabled = unit_test.reportable_disabled_test_count();
  if (num_disabled && !GTEST_FLAG_GET(also_run_disabled_tests)) {
    if (unit_test.Passed()) {
      printf("\n");  // Add a spacer if no FAILURE banner is displayed.
    }
    ColoredPrintf(GTestColor::kYellow, "  YOU HAVE %d DISABLED %s\n\n",
                  num_disabled, num_disabled == 1 ? "TEST" : "TESTS");
  }
  // Ensure that Google Test output is printed before, e.g., heapchecker output.
  fflush(stdout);
}